

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O1

Gia_Man_t * Unm_ManFree(Unm_Man_t *p)

{
  Gia_Man_t *p_00;
  int *piVar1;
  word *__ptr;
  Hash_IntMan_t *__ptr_00;
  Vec_Int_t *pVVar2;
  
  p_00 = p->pNew;
  p->pNew = (Gia_Man_t *)0x0;
  Gia_ManHashStop(p_00);
  if (p_00->vLevels != (Vec_Int_t *)0x0) {
    piVar1 = p_00->vLevels->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p_00->vLevels->pArray = (int *)0x0;
    }
    if (p_00->vLevels != (Vec_Int_t *)0x0) {
      free(p_00->vLevels);
      p_00->vLevels = (Vec_Int_t *)0x0;
    }
  }
  Gia_ManSetRegNum(p_00,p->pGia->nRegs);
  if (p->vTruths != (Vec_Wrd_t *)0x0) {
    __ptr = p->vTruths->pArray;
    if (__ptr != (word *)0x0) {
      free(__ptr);
      p->vTruths->pArray = (word *)0x0;
    }
    if (p->vTruths != (Vec_Wrd_t *)0x0) {
      free(p->vTruths);
      p->vTruths = (Vec_Wrd_t *)0x0;
    }
  }
  if (p->vLeaves != (Vec_Int_t *)0x0) {
    piVar1 = p->vLeaves->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vLeaves->pArray = (int *)0x0;
    }
    if (p->vLeaves != (Vec_Int_t *)0x0) {
      free(p->vLeaves);
      p->vLeaves = (Vec_Int_t *)0x0;
    }
  }
  if (p->vUsed != (Vec_Int_t *)0x0) {
    piVar1 = p->vUsed->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vUsed->pArray = (int *)0x0;
    }
    if (p->vUsed != (Vec_Int_t *)0x0) {
      free(p->vUsed);
      p->vUsed = (Vec_Int_t *)0x0;
    }
  }
  if (p->vId2Used != (Vec_Int_t *)0x0) {
    piVar1 = p->vId2Used->pArray;
    if (piVar1 != (int *)0x0) {
      free(piVar1);
      p->vId2Used->pArray = (int *)0x0;
    }
    if (p->vId2Used != (Vec_Int_t *)0x0) {
      free(p->vId2Used);
      p->vId2Used = (Vec_Int_t *)0x0;
    }
  }
  __ptr_00 = p->pHash;
  pVVar2 = __ptr_00->vObjs;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = __ptr_00->vTable;
  if (pVVar2->pArray != (int *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (int *)0x0;
  }
  if (pVVar2 != (Vec_Int_t *)0x0) {
    free(pVVar2);
  }
  free(__ptr_00);
  free(p);
  Gia_ManStop(p_00);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Unm_ManFree( Unm_Man_t * p )
{
    Gia_Man_t * pTemp = p->pNew; p->pNew = NULL;
    Gia_ManHashStop( pTemp );
    Vec_IntFreeP( &pTemp->vLevels );
    Gia_ManSetRegNum( pTemp, Gia_ManRegNum(p->pGia) );
    // truth tables
    Vec_WrdFreeP( &p->vTruths );
    Vec_IntFreeP( &p->vLeaves );
    Vec_IntFreeP( &p->vUsed );
    Vec_IntFreeP( &p->vId2Used );
    // free data structures
    Hash_IntManStop( p->pHash );
    ABC_FREE( p );

    Gia_ManStop( pTemp );
    pTemp = NULL;

    return pTemp;
}